

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefer_class_enums.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\t");
  std::operator<<(poVar1,'N');
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\t");
  std::operator<<(poVar1,'E');
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\t");
  std::operator<<(poVar1,'W');
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\t");
  std::operator<<(poVar1,'S');
  std::operator<<(poVar1,"\n");
  return 0;
}

Assistant:

int main() {
  std::cout << "\t" << Direction::NORTH << "\n"
            << "\t" << Direction::EAST  << "\n"
            << "\t" << Direction::WEST  << "\n"
            << "\t" << Direction::SOUTH << "\n";
}